

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::usmAllocPropertiesOverride
          (CLIntercept *this,cl_mem_properties_intel *properties,
          cl_mem_properties_intel **pLocalAllocProperties)

{
  undefined1 auVar1 [16];
  SConfig *pSVar2;
  ulong uVar3;
  void *pvVar4;
  long *in_RDX;
  long in_RSI;
  CLIntercept *in_RDI;
  cl_mem_properties_intel flags_1;
  cl_mem_properties_intel flags;
  size_t numProperties;
  bool addMemFlagsEnum;
  cl_mem_flags CL_MEM_ALLOW_UNRESTRICTED_SIZE_INTEL;
  undefined8 local_48;
  ulong local_40;
  bool local_31;
  long local_30;
  bool local_21;
  undefined8 local_20;
  long *local_18;
  long local_10;
  
  local_20 = 0x800000;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pSVar2 = config(in_RDI);
  local_21 = (pSVar2->RelaxAllocationLimits & 1U) != 0;
  local_30 = 0;
  if (local_10 != 0) {
    for (; *(long *)(local_10 + local_30 * 8) != 0; local_30 = local_30 + 2) {
      if (*(long *)(local_10 + local_30 * 8) == 0x1101) {
        local_21 = false;
      }
    }
  }
  if (local_21 != false) {
    local_30 = local_30 + 2;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_30 + 1;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  *local_18 = (long)pvVar4;
  if (*local_18 != 0) {
    local_30 = 0;
    if (local_10 != 0) {
      for (; *(long *)(local_10 + local_30 * 8) != 0; local_30 = local_30 + 2) {
        *(undefined8 *)(*local_18 + local_30 * 8) = *(undefined8 *)(local_10 + local_30 * 8);
        if (*(long *)(local_10 + local_30 * 8) == 0x1101) {
          local_31 = (local_21 & 1U) == 0;
          std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_31);
          local_40 = *(ulong *)(local_10 + 8 + local_30 * 8);
          pSVar2 = config(in_RDI);
          if ((pSVar2->RelaxAllocationLimits & 1U) != 0) {
            local_40 = local_40 | 0x800000;
          }
          *(ulong *)(*local_18 + 8 + local_30 * 8) = local_40;
        }
        else {
          *(undefined8 *)(*local_18 + 8 + local_30 * 8) =
               *(undefined8 *)(local_10 + 8 + local_30 * 8);
        }
      }
    }
    if ((local_21 & 1U) != 0) {
      *(undefined8 *)(*local_18 + local_30 * 8) = 0x1101;
      local_48 = 0;
      pSVar2 = config(in_RDI);
      if ((pSVar2->RelaxAllocationLimits & 1U) != 0) {
        local_48 = 0x800000;
      }
      *(undefined8 *)(*local_18 + 8 + local_30 * 8) = local_48;
      local_30 = local_30 + 2;
    }
    *(undefined8 *)(*local_18 + local_30 * 8) = 0;
  }
  return;
}

Assistant:

void CLIntercept::usmAllocPropertiesOverride(
    const cl_mem_properties_intel* properties,
    cl_mem_properties_intel*& pLocalAllocProperties ) const
{
    const cl_mem_flags CL_MEM_ALLOW_UNRESTRICTED_SIZE_INTEL = (1 << 23);

    bool    addMemFlagsEnum = config().RelaxAllocationLimits != 0;

    size_t  numProperties = 0;
    if( properties )
    {
        while( properties[ numProperties ] != 0 )
        {
            switch( properties[ numProperties ] )
            {
            case CL_MEM_FLAGS:
                addMemFlagsEnum = false;
                break;
            default:
                break;
            }
            numProperties += 2;
        }
    }

    if( addMemFlagsEnum )
    {
        numProperties += 2;
    }

    // Allocate a new array of properties.  We need to allocate two
    // properties for each pair, plus one property for the terminating
    // zero.
    pLocalAllocProperties = new cl_queue_properties[ numProperties + 1 ];
    if( pLocalAllocProperties )
    {
        // Copy the old properties array to the new properties array,
        // if the new properties array exists.
        numProperties = 0;
        if( properties )
        {
            while( properties[ numProperties ] != 0 )
            {
                pLocalAllocProperties[ numProperties ] = properties[ numProperties ];
                if( properties[ numProperties ] == CL_MEM_FLAGS )
                {
                    CLI_ASSERT( addMemFlagsEnum == false );

                    cl_mem_properties_intel flags = properties[ numProperties + 1 ];
                    if( config().RelaxAllocationLimits )
                    {
                        flags |= CL_MEM_ALLOW_UNRESTRICTED_SIZE_INTEL;
                    }

                    pLocalAllocProperties[ numProperties + 1 ] = flags;
                }
                else
                {
                    pLocalAllocProperties[ numProperties + 1 ] =
                        properties[ numProperties + 1 ];
                }
                numProperties += 2;
            }
        }
        if( addMemFlagsEnum )
        {
            pLocalAllocProperties[ numProperties] = CL_MEM_FLAGS;

            cl_mem_properties_intel flags = 0;
            if( config().RelaxAllocationLimits )
            {
                flags |= CL_MEM_ALLOW_UNRESTRICTED_SIZE_INTEL;
            }

            pLocalAllocProperties[ numProperties + 1 ] = flags;
            numProperties += 2;
        }

        // Add the terminating zero.
        pLocalAllocProperties[ numProperties ] = 0;
    }
}